

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 11_struct_as_param.cpp
# Opt level: O1

void convert_rect_to_polar(coord_rect *rect,coord_polar *polar)

{
  double dVar1;
  
  dVar1 = rect->x * rect->x + rect->y * rect->y;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  polar->distance = dVar1;
  dVar1 = atan2(rect->y,rect->x);
  polar->rad = dVar1;
  dVar1 = atan2(rect->y,rect->x);
  polar->deg = (dVar1 * 180.0) / 3.1415926;
  return;
}

Assistant:

void convert_rect_to_polar(coord_rect * rect, coord_polar * polar) {
    using namespace std;
//    coord_polar result;

    polar->distance = sqrt(rect->x * rect->x + rect->y * rect->y);
    polar->rad = atan2(rect->y, rect->x);
    polar->deg = 180 * atan2(rect->y, rect->x) / PI;
//    return result;
}